

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlDOMWrapAdoptBranch
              (xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,xmlDocPtr destDoc
              ,xmlNodePtr destParent,int options)

{
  xmlElementType xVar1;
  xmlChar *str2;
  xmlNsPtr pxVar2;
  bool bVar3;
  _xmlNs **pp_Var4;
  int iVar5;
  _xmlNs *p_Var6;
  xmlNsMapItemPtr_conflict pxVar7;
  xmlNsPtr pxVar8;
  xmlNsPtr pxVar9;
  xmlNs *ns;
  uint uVar10;
  uint uVar11;
  xmlDocPtr pxVar12;
  xmlDocPtr node_00;
  int depth;
  xmlNs **ppxVar13;
  xmlNsMapPtr nsMap;
  xmlNsType in_stack_ffffffffffffff90;
  xmlNsPtr local_68;
  xmlNsPtr local_60;
  int local_54;
  xmlDocPtr local_50;
  xmlDOMWrapCtxtPtr_conflict local_48;
  xmlDocPtr local_40;
  xmlDocPtr local_38;
  
  local_38 = (xmlDocPtr)node;
  local_68 = (xmlNsPtr)0x0;
  local_60 = (xmlNsPtr)0x0;
  local_40 = destDoc;
  if (ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) {
    if (destDoc == (xmlDocPtr)0x0) goto LAB_00152f79;
  }
  else {
    local_68 = (xmlNsPtr)ctxt->namespaceMap;
    bVar3 = true;
    if (destDoc == (xmlDocPtr)0x0) {
LAB_00152f79:
      bVar3 = true;
      local_54 = (int)CONCAT71((int7)((ulong)local_68 >> 8),1);
      goto LAB_00152f7f;
    }
    if (ctxt->getNsForNodeFunc != (xmlDOMWrapAcquireNsFunction)0x0) {
      local_54 = 0;
      goto LAB_00152f7f;
    }
  }
  local_54 = 0;
  bVar3 = false;
LAB_00152f7f:
  local_50 = (xmlDocPtr)0x0;
  depth = -1;
  uVar11 = 0;
  uVar10 = 0;
  pxVar12 = sourceDoc;
LAB_00152f98:
  node_00 = pxVar12;
  if ((node_00->doc != local_38) && (iVar5 = xmlNodeSetDoc((xmlNodePtr)node_00,local_38), iVar5 < 0)
     ) {
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
  }
  switch(node_00->type) {
  case XML_ELEMENT_NODE:
    depth = depth + 1;
    if ((node_00->oldNs == (xmlNsPtr)0x0) ||
       ((ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0 &&
        (ctxt->getNsForNodeFunc != (xmlDOMWrapAcquireNsFunction)0x0)))) {
      local_50 = node_00;
      goto switchD_00152fd1_caseD_2;
    }
    pxVar8 = node_00->oldNs;
    local_48 = ctxt;
    if (bVar3) {
LAB_0015304b:
      do {
        local_60 = pxVar8;
        if (local_68 != (xmlNsPtr)0x0) {
          for (p_Var6 = local_68->next; p_Var6 != (_xmlNs *)0x0; p_Var6 = p_Var6->next) {
            if ((-2 < *(int *)((long)&p_Var6->_private + 4)) && (*(int *)&p_Var6->_private == -1)) {
              str2 = ((xmlNsPtr)p_Var6->prefix)->prefix;
              if ((local_60->prefix == str2) ||
                 (iVar5 = xmlStrEqual(local_60->prefix,str2), iVar5 != 0)) {
                *(int *)&p_Var6->_private = depth;
              }
            }
          }
        }
        pxVar7 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_68,-1,local_60,local_60,depth);
        uVar10 = uVar10 | -(uint)(pxVar7 == (xmlNsMapItemPtr_conflict)0x0);
        pp_Var4 = &local_60->next;
        local_60 = *pp_Var4;
        pxVar8 = local_60;
      } while (*pp_Var4 != (xmlNsPtr)0x0);
      local_50 = node_00;
      ctxt = local_48;
      uVar11 = uVar10;
      goto switchD_00152fd1_caseD_2;
    }
    iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_68,(xmlNodePtr)local_40);
    if (iVar5 == -1) {
      uVar10 = 0xffffffff;
    }
    local_60 = node_00->oldNs;
    bVar3 = true;
    pxVar8 = local_60;
    if (node_00->oldNs != (xmlNsPtr)0x0) goto LAB_0015304b;
    bVar3 = true;
    uVar11 = uVar10;
    if (*(xmlNs **)&node_00->compression != (xmlNs *)0x0) {
      local_50 = node_00;
      goto LAB_00153115;
    }
    local_50 = node_00;
    break;
  case XML_ATTRIBUTE_NODE:
switchD_00152fd1_caseD_2:
    if (*(xmlNs **)&node_00->compression != (xmlNs *)0x0) {
      local_48 = ctxt;
      if (!bVar3) {
        iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_68,(xmlNodePtr)local_40);
        uVar10 = uVar11;
        if (iVar5 == -1) {
          uVar10 = 0xffffffff;
        }
        bVar3 = true;
        uVar11 = uVar10;
      }
LAB_00153115:
      ppxVar13 = (xmlNs **)&node_00->compression;
      p_Var6 = local_68;
      if (local_68 == (xmlNsPtr)0x0) {
LAB_0015313f:
        if (local_48 == (xmlDOMWrapCtxtPtr)0x0) {
          ns = *ppxVar13;
        }
        else {
          ns = *ppxVar13;
          if (local_48->getNsForNodeFunc != (xmlDOMWrapAcquireNsFunction)0x0) {
            local_60 = (*local_48->getNsForNodeFunc)
                                 (local_48,(xmlNodePtr)node_00,ns->href,ns->prefix);
            pxVar7 = xmlDOMWrapNsMapAddItem
                               ((xmlNsMapPtr *)&local_68,-1,*(xmlNsPtr *)&node_00->compression,
                                local_60,-4);
            uVar10 = uVar10 | -(uint)(pxVar7 == (xmlNsMapItemPtr_conflict)0x0);
            p_Var6 = (_xmlNs *)&stack0xffffffffffffff88;
            uVar11 = uVar10;
            goto LAB_001531db;
          }
        }
        pxVar12 = local_50;
        if ((char)local_54 != '\0') {
          pxVar12 = (xmlDocPtr)0x0;
        }
        iVar5 = xmlDOMWrapNSNormAcquireNormalizedNs
                          (local_38,(xmlNodePtr)pxVar12,ns,&local_60,(xmlNsMapPtr *)&local_68,depth,
                           (uint)(node_00->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff90);
        p_Var6 = (_xmlNs *)&stack0xffffffffffffff88;
        uVar11 = uVar10;
        if (iVar5 == -1) {
          uVar10 = 0xffffffff;
          p_Var6 = (_xmlNs *)&stack0xffffffffffffff88;
          uVar11 = uVar10;
        }
      }
      else {
        do {
          p_Var6 = p_Var6->next;
          if (p_Var6 == (_xmlNs *)0x0) goto LAB_0015313f;
        } while ((*(int *)&p_Var6->_private != -1) || (*ppxVar13 != (xmlNs *)p_Var6->href));
      }
LAB_001531db:
      *ppxVar13 = (xmlNs *)p_Var6->prefix;
      ctxt = local_48;
    }
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    goto switchD_00152fd1_caseD_3;
  default:
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
    goto LAB_00153230;
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
    goto switchD_00152fd1_caseD_3;
  }
  if (node_00->type == XML_ELEMENT_NODE) goto code_r0x001531ed;
  goto LAB_00153230;
code_r0x001531ed:
  node_00->version = (xmlChar *)0x0;
  *(undefined4 *)&node_00->encoding = 0;
  pxVar12 = (xmlDocPtr)node_00->extSubset;
  if ((xmlDocPtr)node_00->extSubset == (xmlDocPtr)0x0) {
LAB_00153230:
    while (pxVar12 = (xmlDocPtr)node_00->children, (xmlDocPtr)node_00->children == (xmlDocPtr)0x0) {
switchD_00152fd1_caseD_3:
      do {
        if (node_00 == sourceDoc) {
          if (local_68 != (xmlNsPtr)0x0) {
            if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
               ((xmlNsPtr)ctxt->namespaceMap != local_68)) {
              xmlDOMWrapNsMapFree((xmlNsMapPtr)local_68);
            }
            else {
              pxVar8 = local_68->next;
              if (pxVar8 != (xmlNsPtr)0x0) {
                if ((xmlNsPtr)local_68->href != (xmlNsPtr)0x0) {
                  (*(xmlNsMapItemPtr *)&local_68->type)->next = (xmlNsMapItemPtr)local_68->href;
                  pxVar8 = local_68->next;
                }
                local_68->href = (xmlChar *)pxVar8;
                local_68->next = (_xmlNs *)0x0;
              }
            }
          }
          return uVar10;
        }
        xVar1 = node_00->type;
        if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
           ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
          if ((local_68 != (xmlNsPtr)0x0) && (p_Var6 = local_68->next, p_Var6 != (_xmlNs *)0x0)) {
            pxVar8 = *(xmlNsPtr *)&local_68->type;
            if (pxVar8 == (xmlNsPtr)0x0) goto LAB_001532b5;
            do {
              if (*(int *)((long)&pxVar8->_private + 4) < depth) break;
              pxVar2 = *(xmlNsPtr *)&pxVar8->type;
              *(xmlNsPtr *)&local_68->type = pxVar2;
              pxVar9 = local_68;
              if (pxVar2 != (xmlNsPtr)0x0) {
                pxVar9 = pxVar2;
              }
              pxVar9->next = (_xmlNs *)0x0;
              pxVar8->next = (xmlNsPtr)local_68->href;
              local_68->href = (xmlChar *)pxVar8;
              pxVar8 = *(xmlNsPtr *)&local_68->type;
            } while (pxVar8 != (xmlNsPtr)0x0);
            for (p_Var6 = local_68->next; p_Var6 != (_xmlNs *)0x0; p_Var6 = p_Var6->next) {
LAB_001532b5:
              if (depth <= *(int *)&p_Var6->_private) {
                *(int *)&p_Var6->_private = -1;
              }
            }
          }
          depth = depth + -1;
        }
        pxVar12 = (xmlDocPtr)node_00->next;
        if ((xmlDocPtr)node_00->next != (xmlDocPtr)0x0) goto LAB_00152f98;
        node_00 = (xmlDocPtr)node_00->parent;
      } while (xVar1 != XML_ATTRIBUTE_NODE);
    }
  }
  goto LAB_00152f98;
}

Assistant:

static int
xmlDOMWrapAdoptBranch(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc ATTRIBUTE_UNUSED,
		      xmlNodePtr node,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns = NULL;
    int depth = -1;
    /* gather @parent's ns-decls. */
    int parnsdone;
    /* @ancestorsOnly should be set per option. */
    int ancestorsOnly = 0;

    /*
    * Get the ns-map from the context if available.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;
    /*
    * Disable search for ns-decls in the parent-axis of the
    * destination element, if:
    * 1) there's no destination parent
    * 2) custom ns-reference handling is used
    */
    if ((destParent == NULL) ||
	(ctxt && ctxt->getNsForNodeFunc))
    {
	parnsdone = 1;
    } else
	parnsdone = 0;

    cur = node;

    while (cur != NULL) {
        if (cur->doc != destDoc) {
            if (xmlNodeSetDoc(cur, destDoc) < 0)
                ret = -1;
        }

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		ret = -1;
                goto leave_node;
	    case XML_ELEMENT_NODE:
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		* - ns->href and ns->prefix are never in the dict, so
		*   we need not move the values over to the destination dict.
		* - Note that for custom handling of ns-references,
		*   the ns-decls need not be stored in the ns-map,
		*   since they won't be referenced by node->ns.
		*/
		if ((cur->nsDef) &&
		    ((ctxt == NULL) || (ctxt->getNsForNodeFunc == NULL)))
		{
		    if (! parnsdone) {
			/*
			* Gather @parent's in-scope ns-decls.
			*/
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			    destParent) == -1)
			    ret = -1;
			parnsdone = 1;
		    }
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* NOTE: ns->prefix and ns->href are never in the dict.
			*/
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix,
				    mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    ns, ns, depth) == NULL)
			    ret = -1;
		    }
		}
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No namespace, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			destParent) == -1)
			ret = -1;
		    parnsdone = 1;
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* No matching namespace in scope. We need a new one.
		*/
		if ((ctxt) && (ctxt->getNsForNodeFunc)) {
		    /*
		    * User-defined behaviour.
		    */
		    ns = ctxt->getNsForNodeFunc(ctxt, cur,
			cur->ns->href, cur->ns->prefix);
		    /*
		    * Insert mapping if ns is available; it's the users fault
		    * if not.
		    */
		    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
			ret = -1;
		    cur->ns = ns;
		} else {
		    /*
		    * Acquire a normalized ns-decl and add it to the map.
		    */
		    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
			/* ns-decls on curElem or on destDoc->oldNs */
			destParent ? curElem : NULL,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			/* ns-decls must be prefixed for attributes. */
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
			ret = -1;
		    cur->ns = ns;
		}

ns_end:
		if (cur->type == XML_ELEMENT_NODE) {
		    cur->psvi = NULL;
		    cur->line = 0;
		    cur->extra = 0;
		    /*
		    * Walk attributes.
		    */
		    if (cur->properties != NULL) {
			/*
			* Process first attribute node.
			*/
			cur = (xmlNodePtr) cur->properties;
			continue;
		    }
		}
		break;
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_ENTITY_REF_NODE:
		goto leave_node;
	    default:
		ret = -1;
	}
	/*
	* Walk the tree.
	*/
	if (cur->children != NULL) {
	    cur = cur->children;
	    continue;
	}

leave_node:
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END))
	{
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else if ((cur->type == XML_ATTRIBUTE_NODE) &&
	    (cur->parent->children != NULL))
	{
	    cur = cur->parent->children;
	} else {
	    cur = cur->parent;
	    goto leave_node;
	}
    }

    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    return(ret);
}